

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

int __thiscall
ON_TextureMapping::EvaluateCylinderMapping
          (ON_TextureMapping *this,ON_3dPoint *P,ON_3dVector *N,ON_3dPoint *T)

{
  int iVar1;
  double local_1a8;
  ON_3dPoint local_198;
  undefined1 local_180 [8];
  ON_3dVector n_1;
  ON_3dPoint local_150;
  ON_3dVector local_138;
  ON_3dPoint local_120;
  int local_104;
  undefined1 local_100 [4];
  int rc;
  ON_3dPoint local_e8;
  ON_3dVector local_d0;
  ON_3dPoint local_b8;
  undefined1 local_a0 [8];
  ON_3dVector n;
  PROJECTION local_80;
  PROJECTION mapping_proj;
  int side1;
  int side0;
  double t1;
  double t0;
  double t;
  double r;
  ON_3dPoint Q;
  ON_3dPoint rst;
  ON_3dPoint *T_local;
  ON_3dVector *N_local;
  ON_3dPoint *P_local;
  ON_TextureMapping *this_local;
  
  ON_Xform::operator*((ON_3dPoint *)&Q.z,&this->m_Pxyz,P);
  t = ON_2dVector::Length((ON_2dVector *)&Q.z);
  n.z._4_4_ = this->m_projection;
  mapping_proj = no_projection;
  if (n.z._4_4_ == ray_projection) {
    ON_Xform::operator*((ON_3dVector *)local_a0,&this->m_Nxyz,N);
    t0 = 0.0;
    if ((((this->m_bCapped & 1U) != 0) && (t0 = ABS(n.y) * 1e+100, ABS(rst.y + 1.0) < t0)) &&
       (ABS(1.0 - rst.y) < t0)) {
      mapping_proj = ray_projection;
      local_80 = ray_projection|clspt_projection;
      t1 = (-1.0 - rst.y) / n.y;
      ::operator*(&local_d0,t1,(ON_3dVector *)local_a0);
      ON_3dPoint::operator+(&local_b8,(ON_3dPoint *)&Q.z,&local_d0);
      r = local_b8.x;
      Q.x = local_b8.y;
      Q.y = local_b8.z;
      if ((1.490116119385e-08 < ABS(local_b8.z + 1.0)) ||
         (1.0000000298023226 < local_b8.x * local_b8.x + local_b8.y * local_b8.y)) {
        mapping_proj = no_projection;
      }
      _side1 = (1.0 - rst.y) / n.y;
      ::operator*((ON_3dVector *)local_100,_side1,(ON_3dVector *)local_a0);
      ON_3dPoint::operator+(&local_e8,(ON_3dPoint *)&Q.z,(ON_3dVector *)local_100);
      r = local_e8.x;
      Q.x = local_e8.y;
      Q.y = local_e8.z;
      if ((1.490116119385e-08 < ABS(1.0 - local_e8.z)) ||
         (1.0000000298023226 < local_e8.x * local_e8.x + local_e8.y * local_e8.y)) {
        local_80 = no_projection;
      }
      if ((mapping_proj == no_projection) || (iVar1 = BestHitHelper(t1,_side1), iVar1 == 1)) {
        mapping_proj = local_80;
        t0 = _side1;
      }
      else {
        t0 = t1;
      }
    }
    local_104 = ON_SolveQuadraticEquation
                          ((double)local_a0 * (double)local_a0 + n.x * n.x,
                           (Q.z * (double)local_a0 + rst.x * n.x) * 2.0,
                           (Q.z * Q.z + rst.x * rst.x) - 1.0,&t1,(double *)&side1);
    if (-1 < local_104) {
      if ((local_104 != 2) && (iVar1 = BestHitHelper(t1,_side1), iVar1 == 1)) {
        t1 = _side1;
      }
      if (mapping_proj == no_projection) {
        mapping_proj = clspt_projection;
        ::operator*(&local_138,t1,(ON_3dVector *)local_a0);
        ON_3dPoint::operator+(&local_120,(ON_3dPoint *)&Q.z,&local_138);
        Q.z = local_120.x;
        rst.x = local_120.y;
        rst.y = local_120.z;
      }
      else {
        iVar1 = BestHitHelper(t1,t0);
        if (((iVar1 != 1) && (_side1 = t1 * n.y + rst.y, -1.0000000149011612 <= _side1)) &&
           (_side1 <= 1.0000000149011612)) {
          mapping_proj = clspt_projection;
          rst.x = t1 * n.x + rst.x;
          Q.z = _side1;
        }
      }
    }
    if (clspt_projection < mapping_proj) {
      ::operator*((ON_3dVector *)&n_1.z,t0,(ON_3dVector *)local_a0);
      ON_3dPoint::operator+(&local_150,(ON_3dPoint *)&Q.z,(ON_3dVector *)&n_1.z);
      Q.z = local_150.x;
      rst.x = local_150.y;
      rst.y = local_150.z;
    }
  }
  if (((this->m_bCapped & 1U) != 0) && (mapping_proj == no_projection)) {
    if (ABS(rst.y) <= 1.0000000149011612) {
      if (((t <= 1.001) &&
          (ON_Xform::operator*((ON_3dVector *)local_180,&this->m_Nxyz,N),
          ABS((double)local_180) < ABS(n_1.y))) &&
         ((ABS(n_1.x) < ABS(n_1.y) && (mapping_proj = ray_projection|clspt_projection, n_1.y < 0.0))
         )) {
        mapping_proj = ray_projection;
      }
    }
    else if ((t < ABS(rst.y)) && (mapping_proj = ray_projection|clspt_projection, rst.y < 0.0)) {
      mapping_proj = ray_projection;
    }
  }
  if ((mapping_proj == ray_projection) || (mapping_proj == (ray_projection|clspt_projection))) {
    if (mapping_proj == ray_projection) {
      Q.z = -Q.z;
    }
    if (this->m_texture_space == divided) {
      if (0.9999999850988388 <= t) {
        Q.z = Q.z / (t + 1.490116119385e-08);
      }
    }
    else if (1.0 < t) {
      Q.z = Q.z / t;
    }
    Q.z = Q.z * 0.5 + 0.5;
    if (0.0 <= Q.z) {
      if (1.0 < Q.z) {
        Q.z = 1.0;
      }
    }
    else {
      Q.z = 0.0;
    }
    if (this->m_texture_space == divided) {
      Q.z = ((double)mapping_proj + 2.0 + Q.z) / 6.0;
    }
  }
  else {
    if ((((rst.x != 0.0) || (NAN(rst.x))) || (Q.z != 0.0)) || (NAN(Q.z))) {
      local_1a8 = atan2(rst.x,Q.z);
    }
    else {
      local_1a8 = 0.0;
    }
    t0 = local_1a8;
    Q.z = (local_1a8 * 0.5) / 3.141592653589793;
    if (-2.220446049250313e-16 <= Q.z) {
      if (0.0 <= Q.z) {
        if (1.0 < Q.z) {
          Q.z = 1.0;
        }
      }
      else {
        Q.z = 0.0;
      }
    }
    else {
      Q.z = Q.z + 1.0;
    }
    if (this->m_texture_space == divided) {
      Q.z = (Q.z * 2.0) / 3.0;
    }
    mapping_proj = clspt_projection;
  }
  ON_Xform::operator*(&local_198,&this->m_uvw,(ON_3dPoint *)&Q.z);
  T->x = local_198.x;
  T->y = local_198.y;
  T->z = local_198.z;
  return mapping_proj;
}

Assistant:

int ON_TextureMapping::EvaluateCylinderMapping(
												const ON_3dPoint& P,
												const ON_3dVector& N,
												ON_3dPoint* T
												) const
{
  // The matrix m_Pxyz transforms the world coordinate
  // "mapping cylinder" into the cylinder centered at
  // rst = (0,0,0) with radius 1.0.  The axis runs
  // from rst = (0,0,-1) to rst = (0,0,+1).

	ON_3dPoint rst(m_Pxyz*P);

	ON_3dPoint Q;
	const double r = ((const ON_2dVector*)(&rst.x))->Length();
	double t, t0, t1;
	int side0, side1;
	PROJECTION mapping_proj = m_projection;

	side0 = 0;
	if ( ON_TextureMapping::PROJECTION::ray_projection == mapping_proj )
	{
		ON_3dVector n(m_Nxyz*N);
		t = 0.0;

		if ( m_bCapped )
		{
			// shoot at caps
			//  The < t check prevents overflow when the
			//  ray is nearly parallel to the cap.
			t = fabs(n.z)*on__overflow_tol;
			if ( fabs(1.0+rst.z) < t && fabs(1.0-rst.z) < t )
			{
				side0 = 2;
				side1 = 3;

				t0 = (-1.0 - rst.z)/n.z;
				Q = rst + t0*n;
				if ( fabs(1.0+Q.z) > ON_SQRT_EPSILON
					|| (Q.x*Q.x + Q.y*Q.y) > 1.0 + 2.0*ON_SQRT_EPSILON + ON_EPSILON )
				{
          // The ray's intersection with the bottom plane missed the
          // radius 1 disk that is the bottom of the cylinder.
					side0 = 0;
				}

				t1 = ( 1.0 - rst.z)/n.z;
				Q = rst + t1*n;
				if ( fabs(1.0-Q.z) > ON_SQRT_EPSILON
					|| (Q.x*Q.x + Q.y*Q.y) > 1.0 + 2.0*ON_SQRT_EPSILON + ON_EPSILON )
				{
          // The ray's intersection with the top plane missed the
          // radius 1 disk that is the top of the cylinder.
					side1 = 0;
				}
				if ( 0 == side0 || 1 == BestHitHelper(t0,t1) )
				{
					side0 = side1;
					t = t1;
				}
				else
				{
					t = t0;
				}
			}
		}

		// shoot ray at the cylinder wall
		int rc = ON_SolveQuadraticEquation( (n.x*n.x+n.y*n.y),
			2.0*(rst.x*n.x+rst.y*n.y),
			(rst.x*rst.x+rst.y*rst.y) - 1.0,
			&t0, &t1 );
		if (rc >= 0 )
		{
			if ( 2 != rc  && 1 == BestHitHelper(t0,t1) )
			{
				t0 = t1;
			}
			if ( 0 == side0 )
			{
				// Either the caps are missing or the ray missed the caps.
        // The best hit is the cylinder wall.
				side0 = 1;
				rst = rst + t0*n;
			}
			else if ( 1 != BestHitHelper(t0,t) )
			{
				// The cylinder is capped and the ray hit the cap,
        // hit the infinite cylinder wall, and the wall
        // hit is "first".  If the ray hits the finite
        // cylinder wall, the I will use the wall hit.
				t1 = rst.z + t0*n.z;
				if ( t1 >= -(1.0+ON_SQRT_EPSILON) && t1 <= 1.0+ON_SQRT_EPSILON )
				{
					// use the hit on the cylinder wall
					side0 = 1;
					rst.x = rst.x + t0*n.x;
					rst.y = rst.y + t0*n.y;
          rst.x = t1;
				}
			}
		}

		if ( side0 > 1 )
		{
			// best hit is on a cap
			rst = rst + t*n;
		}
	}

	if ( m_bCapped && 0 == side0 )
	{
    if ( fabs(rst.z) > 1.0+ON_SQRT_EPSILON )
    {
      if ( fabs(rst.z) > r )
      {
        side0 = (rst.z < 0.0) ? 2 : 3;
      }
    }
    else if ( r <= 1.001 )
    {
      // The point is inside the capped cylinder.
      // Use normal to determine which surface to use
      // for closest point test.
		  ON_3dVector n(m_Nxyz*N);
      if (  ( fabs(n.z) > fabs(n.x) && fabs(n.z) > fabs(n.y) ) )
      {
        side0 = (n.z < 0.0) ? 2 : 3;
      }
    }
	}

	if ( 2 == side0 || 3 == side0 )
	{
    // The cylinder is capped and P maps to
    // the top (1 == side0) or bottom (2 == side0)

    if ( 2 == side0 )
    {
      // This is the same convention as box mapping.
      // Put another way, if you change the mapping
      // between box and cylinder, you get the same
      // picture on the top and bottom.
      rst.x = -rst.x;
    }

		if ( ON_TextureMapping::TEXTURE_SPACE::divided == m_texture_space )
		{
		  if ( r >= 1.0-ON_SQRT_EPSILON )
		  {
			  rst.x /= (r+ON_SQRT_EPSILON);
			  rst.y /= (r+ON_SQRT_EPSILON);
		  }
    }
    else if ( r > 1.0 )
	  {
		  rst.x /= r;
		  rst.y /= r;
	  }


    // convert to normalized texture coordinates
		rst.x = 0.5*rst.x + 0.5;
    if ( rst.x < 0.0) rst.x = 0.0; else if (rst.x > 1.0) rst.x = 1.0;
		rst.y = 0.5*rst.y + 0.5;
    if ( rst.y < 0.0) rst.y = 0.0; else if (rst.y > 1.0) rst.y = 1.0;

		if ( ON_TextureMapping::TEXTURE_SPACE::divided == m_texture_space )
		{
      // bottom uses 4/6 <= x <= 5/6 region of the texture map.
      // top uses 5/6 <= x <= 1 region of the texture map.
			rst.x = (2.0 + side0 + rst.x)/6.0;
		}
	}
	else
	{
    // P maps to side of the cylinder.
    //
    // convert longitude to normalized texture coordinate
		t = (0.0 != rst.y || 0.0 != rst.x) ? atan2(rst.y,rst.x) : 0.0;
		rst.x = 0.5*t/ON_PI;
		if ( rst.x < -ON_EPSILON )
			rst.x += 1.0;
		else if (rst.x < 0.0 )
			rst.x = 0.0;
		else if (rst.x > 1.0 )
			rst.x = 1.0;

    if ( ON_TextureMapping::TEXTURE_SPACE::divided == m_texture_space )
    {
      // side uses 0 <= x <= 2/3 region of the texture map
      rst.x *= 2.0;
			rst.x /= 3.0;
    }

    // convert height to normalized texture coordinate
  	rst.y = 0.5*rst.z + 0.5;
    if ( m_bCapped )
    {
      // clamp height
      if ( rst.y < 0.0 ) rst.y = 0.0; else if ( rst.y > 1.0 ) rst.y = 1.0;
    }
    side0 = 1;
	}
	rst.z = r;

	*T = m_uvw*rst;

  return side0;
}